

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

int test_bind_impl(char *file,int line,int sock,char *address)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  int rc;
  char *address_local;
  int sock_local;
  int line_local;
  char *file_local;
  
  iVar1 = nn_bind(sock,address);
  __stream = _stderr;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(__stream,"Failed bind to \"%s\": %s [%d] (%s:%d)\n",address,pcVar3,(ulong)*puVar4,file,
            line);
    nn_err_abort();
  }
  return iVar1;
}

Assistant:

static int NN_UNUSED test_bind_impl (char *file, int line,
    int sock, char *address)
{
    int rc;

    rc = nn_bind (sock, address);
    if(rc < 0) {
        fprintf (stderr, "Failed bind to \"%s\": %s [%d] (%s:%d)\n",
            address,
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
    return rc;
}